

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void std::
     __unguarded_linear_insert<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Val_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>>>
               (undefined8 *__last)

{
  undefined4 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  value_type __val;
  float fStack_4;
  
  uVar2 = *__last;
  uVar1 = *(undefined4 *)(__last + 1);
  __val.m_data[0] = (float)uVar2;
  do {
    fVar5 = *(float *)((long)__last + -0xc);
    if (fVar5 <= __val.m_data[0]) {
      lVar3 = -2;
      fVar6 = __val.m_data[0];
      do {
        lVar4 = lVar3;
        if ((fVar5 < fVar6) || (lVar4 == 0)) goto LAB_003e49fa;
        fVar6 = (&fStack_4)[lVar4];
        fVar5 = *(float *)((long)__last + lVar4 * 4);
        lVar3 = lVar4 + 1;
      } while (fVar5 <= fVar6);
      if (1 < lVar4 + 2U) {
LAB_003e49fa:
        *(undefined4 *)(__last + 1) = uVar1;
        *__last = uVar2;
        return;
      }
    }
    *(undefined4 *)(__last + 1) = *(undefined4 *)((long)__last + -4);
    *__last = *(undefined8 *)((long)__last + -0xc);
    __last = (undefined8 *)((long)__last + -0xc);
  } while( true );
}

Assistant:

inline Vector<T, Size>::Vector (const Vector<T, Size>& v)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = v.m_data[i];
}